

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Merger.h
# Opt level: O2

bool __thiscall
PairedEnd::Merger<DNA>::FindBestOverlap
          (Merger<DNA> *this,Sequence<DNA> *seq1,Sequence<DNA> *seq2,OverlapInfo *overlap)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  int iVar9;
  double local_38;
  
  uVar1 = (uint)(seq1->sequence)._M_string_length;
  iVar2 = (int)(seq2->sequence)._M_string_length;
  overlap->length = 0;
  overlap->pos1 = 0;
  overlap->pos2 = 0;
  local_38 = 2.2250738585072014e-308;
  iVar9 = 0;
  uVar6 = uVar1;
  while( true ) {
    if ((int)(iVar2 + uVar1) < iVar9) break;
    uVar5 = iVar9 - uVar1;
    if ((int)(iVar9 - uVar1) < 1) {
      uVar5 = 0;
    }
    iVar4 = iVar2 - uVar5;
    if (iVar9 < iVar4) {
      iVar4 = iVar9;
    }
    if (this->mMinOverlap <= iVar4) {
      sVar8 = 0;
      if (0 < (int)uVar6) {
        sVar8 = (ulong)uVar6;
      }
      uVar7 = (ulong)uVar5;
      dVar3 = ComputeOverlapScore(this,(seq1->sequence)._M_dataplus._M_p + sVar8,
                                  (seq2->sequence)._M_dataplus._M_p + uVar7,
                                  (seq1->quality)._M_dataplus._M_p + sVar8,
                                  (seq2->quality)._M_dataplus._M_p + uVar7,(long)iVar4);
      if (local_38 < dVar3) {
        overlap->length = (long)iVar4;
        overlap->pos1 = sVar8;
        overlap->pos2 = uVar7;
        local_38 = dVar3;
      }
    }
    iVar9 = iVar9 + 1;
    uVar6 = uVar6 - 1;
  }
  return 2.2250738585072014e-308 < local_38;
}

Assistant:

bool Merger< A >::FindBestOverlap( const Sequence< A >& seq1,
                                   const Sequence< A >& seq2,
                                   OverlapInfo*         overlap ) const {
  int len1 = seq1.Length();
  int len2 = seq2.Length();

  overlap->length = 0;
  overlap->pos1   = 0;
  overlap->pos2   = 0;

  double bestScore = DBL_MIN;

  // Slide base by base, finding best overlap
  for( int i = 0; i <= len1 + len2; i++ ) {
    int pos1 = std::max( len1 - i, 0 );
    int pos2 = std::max( i - len1, 0 );

    int length = std::min( len2 - pos2, i );
    if( length < mMinOverlap )
      continue;

    double score = ComputeOverlapScore(
      seq1.sequence.c_str() + pos1, seq2.sequence.c_str() + pos2,
      seq1.quality.c_str() + pos1, seq2.quality.c_str() + pos2, length );

    if( score > bestScore ) {
      bestScore       = score;
      overlap->length = length;
      overlap->pos1   = pos1;
      overlap->pos2   = pos2;
    }
  }

  return ( bestScore > DBL_MIN );
}